

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O0

void __thiscall duckdb::LoadCommand::ExecuteInternal(LoadCommand *this,ExecuteContext *context)

{
  bool bVar1;
  pointer pDVar2;
  long in_RDI;
  vector<duckdb::LoopDefinition,_true> *in_stack_00000048;
  string *in_stack_00000050;
  SQLLogicTestRunner *in_stack_00000058;
  string resolved_path;
  SerializationCompatibility *in_stack_fffffffffffffef8;
  SerializationCompatibility *in_stack_ffffffffffffff00;
  undefined8 *puVar3;
  string *in_stack_ffffffffffffff60;
  string local_80 [48];
  string local_50 [32];
  string local_30 [48];
  
  std::__cxx11::string::string(local_50,(string *)(in_RDI + 0x90));
  SQLLogicTestRunner::LoopReplacement(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_50);
  if ((*(byte *)(in_RDI + 0xb0) & 1) == 0) {
    std::__cxx11::string::string(local_80,local_30);
    DeleteDatabase(in_stack_ffffffffffffff60);
    std::__cxx11::string::~string(local_80);
  }
  std::__cxx11::string::operator=((string *)(*(long *)(in_RDI + 8) + 8),local_30);
  if ((*(byte *)(in_RDI + 0xb0) & 1) == 0) {
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       ((unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *
                        )in_stack_ffffffffffffff00);
    pDVar2[0x148] = (DBConfig)0x1;
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       ((unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *
                        )in_stack_ffffffffffffff00);
    pDVar2[0xd0] = (DBConfig)0x1;
  }
  else {
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       ((unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *
                        )in_stack_ffffffffffffff00);
    pDVar2[0x148] = (DBConfig)0x0;
    pDVar2 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       ((unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *
                        )in_stack_ffffffffffffff00);
    pDVar2[0xd0] = (DBConfig)0x2;
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_> *)0x7c7436);
  if (bVar1) {
    unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator->
              ((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *)
               in_stack_ffffffffffffff00);
    shared_ptr<duckdb::DatabaseInstance,_true>::operator->
              ((shared_ptr<duckdb::DatabaseInstance,_true> *)in_stack_ffffffffffffff00);
    unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
              ((unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *)
               in_stack_ffffffffffffff00);
    SerializationCompatibility::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  puVar3 = *(undefined8 **)(in_RDI + 8);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff60,local_30);
  (**(code **)*puVar3)(puVar3,&stack0xffffffffffffff60,1);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void LoadCommand::ExecuteInternal(ExecuteContext &context) const {
	auto resolved_path = runner.LoopReplacement(dbpath, context.running_loops);
	if (!readonly) {
		// delete the target database file, if it exists
		DeleteDatabase(resolved_path);
	}
	runner.dbpath = resolved_path;

	// set up the config file
	if (readonly) {
		runner.config->options.use_temporary_directory = false;
		runner.config->options.access_mode = AccessMode::READ_ONLY;
	} else {
		runner.config->options.use_temporary_directory = true;
		runner.config->options.access_mode = AccessMode::AUTOMATIC;
	}
	if (runner.db) {
		runner.config->options.serialization_compatibility =
		    runner.db->instance->config.options.serialization_compatibility;
	}
	// now create the database file
	runner.LoadDatabase(resolved_path, true);
}